

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_rb_commit_read(ma_rb *pRB,size_t sizeInBytes,void *pBufferOut)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if ((pRB != (ma_rb *)0x0) &&
     ((void *)((ulong)(pRB->encodedReadOffset & 0x7fffffff) + (long)pRB->pBuffer) == pBufferOut)) {
    uVar3 = (int)sizeInBytes + (pRB->encodedReadOffset & 0x7fffffff);
    if (uVar3 <= pRB->subbufferSizeInBytes) {
      uVar1 = pRB->encodedReadOffset & 0x80000000;
      uVar2 = uVar1 | uVar3;
      if (uVar3 == pRB->subbufferSizeInBytes) {
        uVar2 = uVar1 ^ 0x80000000;
      }
      LOCK();
      pRB->encodedReadOffset = uVar2;
      UNLOCK();
      return 0;
    }
  }
  return -2;
}

Assistant:

MA_API ma_result ma_rb_commit_read(ma_rb* pRB, size_t sizeInBytes, void* pBufferOut)
{
    ma_uint32 readOffset;
    ma_uint32 readOffsetInBytes;
    ma_uint32 readOffsetLoopFlag;
    ma_uint32 newReadOffsetInBytes;
    ma_uint32 newReadOffsetLoopFlag;

    if (pRB == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Validate the buffer. */
    if (pBufferOut != ma_rb__get_read_ptr(pRB)) {
        return MA_INVALID_ARGS;
    }

    readOffset = c89atomic_load_32(&pRB->encodedReadOffset);
    ma_rb__deconstruct_offset(readOffset, &readOffsetInBytes, &readOffsetLoopFlag);

    /* Check that sizeInBytes is correct. It should never go beyond the end of the buffer. */
    newReadOffsetInBytes = (ma_uint32)(readOffsetInBytes + sizeInBytes);
    if (newReadOffsetInBytes > pRB->subbufferSizeInBytes) {
        return MA_INVALID_ARGS;    /* <-- sizeInBytes will cause the read offset to overflow. */
    }

    /* Move the read pointer back to the start if necessary. */
    newReadOffsetLoopFlag = readOffsetLoopFlag;
    if (newReadOffsetInBytes == pRB->subbufferSizeInBytes) {
        newReadOffsetInBytes = 0;
        newReadOffsetLoopFlag ^= 0x80000000;
    }

    c89atomic_exchange_32(&pRB->encodedReadOffset, ma_rb__construct_offset(newReadOffsetLoopFlag, newReadOffsetInBytes));
    return MA_SUCCESS;
}